

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void assign_old_filename(filemgr *file,char *old_filename)

{
  size_t sVar1;
  char *__dest;
  
  free(file->old_filename);
  if (old_filename != (char *)0x0) {
    sVar1 = strlen(old_filename);
    __dest = (char *)malloc(sVar1 + 1);
    file->old_filename = __dest;
    strcpy(__dest,old_filename);
    return;
  }
  file->old_filename = (char *)0x0;
  return;
}

Assistant:

static void assign_old_filename(struct filemgr *file, const char *old_filename)
{
    free(file->old_filename);
    if (old_filename) {
        file->old_filename = (char*)malloc(strlen(old_filename) + 1);
        strcpy(file->old_filename, old_filename);
    } else {
        file->old_filename = NULL;
    }
}